

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

int mpc_parse_input(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r)

{
  mpc_mem_t *pmVar1;
  char **ppcVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  undefined4 uVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  mpc_input_t *pmVar14;
  mpc_input_t *pmVar15;
  mpc_input_t *pmVar16;
  mpc_input_t *pmVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  mpc_err_t *e;
  mpc_err_t *local_38;
  
  local_38 = mpc_err_fail(i,"Unknown Error");
  *(undefined4 *)&(local_38->state).pos = 0xffffffff;
  *(undefined4 *)((long)&(local_38->state).pos + 4) = 0xffffffff;
  *(undefined4 *)&(local_38->state).row = 0xffffffff;
  *(undefined4 *)((long)&(local_38->state).row + 4) = 0xffffffff;
  (local_38->state).col = -1;
  (local_38->state).term = 0;
  iVar13 = mpc_parse_run(i,p,r,&local_38,0);
  if (iVar13 == 0) {
    pmVar14 = (mpc_input_t *)mpc_err_merge(i,local_38,r->error);
    lVar19 = (long)(int)(pmVar14->state).col;
    if (0 < lVar19) {
      lVar18 = 0;
      do {
        ppcVar2 = (char **)pmVar14->buffer;
        pmVar17 = (mpc_input_t *)ppcVar2[lVar18];
        pmVar15 = pmVar17;
        if (pmVar17 < i + 1 && i->mem <= pmVar17) {
          pmVar15 = (mpc_input_t *)malloc(0x40);
          uVar10 = *(undefined4 *)&pmVar17->field_0x4;
          pcVar4 = pmVar17->filename;
          lVar5 = (pmVar17->state).pos;
          lVar6 = (pmVar17->state).row;
          lVar7 = (pmVar17->state).col;
          iVar11 = (pmVar17->state).term;
          uVar12 = *(undefined4 *)&(pmVar17->state).field_0x1c;
          pcVar8 = pmVar17->string;
          pcVar9 = pmVar17->buffer;
          pmVar15->type = pmVar17->type;
          *(undefined4 *)&pmVar15->field_0x4 = uVar10;
          pmVar15->filename = pcVar4;
          (pmVar15->state).pos = lVar5;
          (pmVar15->state).row = lVar6;
          (pmVar15->state).col = lVar7;
          (pmVar15->state).term = iVar11;
          *(undefined4 *)&(pmVar15->state).field_0x1c = uVar12;
          pmVar15->string = pcVar8;
          pmVar15->buffer = pcVar9;
          i->mem_full[(ulong)((long)pmVar17 - (long)i->mem) >> 6] = '\0';
        }
        ppcVar2[lVar18] = (char *)pmVar15;
        lVar18 = lVar18 + 1;
      } while (lVar19 != lVar18);
    }
    pmVar15 = (mpc_input_t *)pmVar14->buffer;
    pmVar1 = i->mem;
    pmVar17 = i + 1;
    pmVar16 = pmVar15;
    if (pmVar15 < pmVar17 && pmVar1 <= pmVar15) {
      pmVar16 = (mpc_input_t *)malloc(0x40);
      uVar10 = *(undefined4 *)&pmVar15->field_0x4;
      pcVar4 = pmVar15->filename;
      lVar19 = (pmVar15->state).pos;
      lVar18 = (pmVar15->state).row;
      lVar5 = (pmVar15->state).col;
      iVar11 = (pmVar15->state).term;
      uVar12 = *(undefined4 *)&(pmVar15->state).field_0x1c;
      pcVar8 = pmVar15->string;
      ppcVar2 = (char **)pmVar15->buffer;
      pmVar16->type = pmVar15->type;
      *(undefined4 *)&pmVar16->field_0x4 = uVar10;
      pmVar16->filename = pcVar4;
      (pmVar16->state).pos = lVar19;
      (pmVar16->state).row = lVar18;
      (pmVar16->state).col = lVar5;
      (pmVar16->state).term = iVar11;
      *(undefined4 *)&(pmVar16->state).field_0x1c = uVar12;
      pmVar16->string = pcVar8;
      pmVar16->buffer = (char *)ppcVar2;
      i->mem_full[(ulong)((long)pmVar15 - (long)pmVar1) >> 6] = '\0';
    }
    pmVar14->buffer = (char *)pmVar16;
    pmVar15 = *(mpc_input_t **)&(pmVar14->state).term;
    pmVar16 = pmVar15;
    if (pmVar15 < pmVar17 && pmVar1 <= pmVar15) {
      pmVar16 = (mpc_input_t *)malloc(0x40);
      uVar10 = *(undefined4 *)&pmVar15->field_0x4;
      pcVar4 = pmVar15->filename;
      lVar19 = (pmVar15->state).pos;
      lVar18 = (pmVar15->state).row;
      lVar5 = (pmVar15->state).col;
      iVar11 = (pmVar15->state).term;
      uVar12 = *(undefined4 *)&(pmVar15->state).field_0x1c;
      pcVar8 = pmVar15->string;
      ppcVar2 = (char **)pmVar15->buffer;
      pmVar16->type = pmVar15->type;
      *(undefined4 *)&pmVar16->field_0x4 = uVar10;
      pmVar16->filename = pcVar4;
      (pmVar16->state).pos = lVar19;
      (pmVar16->state).row = lVar18;
      (pmVar16->state).col = lVar5;
      (pmVar16->state).term = iVar11;
      *(undefined4 *)&(pmVar16->state).field_0x1c = uVar12;
      pmVar16->string = pcVar8;
      pmVar16->buffer = (char *)ppcVar2;
      i->mem_full[(ulong)((long)pmVar15 - (long)pmVar1) >> 6] = '\0';
    }
    *(mpc_input_t **)&(pmVar14->state).term = pmVar16;
    pmVar15 = (mpc_input_t *)pmVar14->string;
    pmVar16 = pmVar15;
    if (pmVar15 < pmVar17 && pmVar1 <= pmVar15) {
      pmVar16 = (mpc_input_t *)malloc(0x40);
      uVar10 = *(undefined4 *)&pmVar15->field_0x4;
      pcVar4 = pmVar15->filename;
      lVar19 = (pmVar15->state).pos;
      lVar18 = (pmVar15->state).row;
      lVar5 = (pmVar15->state).col;
      iVar11 = (pmVar15->state).term;
      uVar12 = *(undefined4 *)&(pmVar15->state).field_0x1c;
      pcVar8 = pmVar15->string;
      ppcVar2 = (char **)pmVar15->buffer;
      pmVar16->type = pmVar15->type;
      *(undefined4 *)&pmVar16->field_0x4 = uVar10;
      pmVar16->filename = pcVar4;
      (pmVar16->state).pos = lVar19;
      (pmVar16->state).row = lVar18;
      (pmVar16->state).col = lVar5;
      (pmVar16->state).term = iVar11;
      *(undefined4 *)&(pmVar16->state).field_0x1c = uVar12;
      pmVar16->string = pcVar8;
      pmVar16->buffer = (char *)ppcVar2;
      i->mem_full[(ulong)((long)pmVar15 - (long)pmVar1) >> 6] = '\0';
    }
    pmVar14->string = (char *)pmVar16;
    bVar3 = pmVar14 < pmVar1;
    bVar20 = pmVar17 < pmVar14;
    bVar21 = pmVar17 == pmVar14;
  }
  else {
    mpc_err_delete_internal(i,local_38);
    pmVar14 = (mpc_input_t *)r->error;
    bVar3 = pmVar14 < i->mem;
    bVar20 = i + 1 < pmVar14;
    bVar21 = i + 1 == pmVar14;
  }
  pmVar17 = pmVar14;
  if (!(bool)((bVar20 || bVar21) | bVar3)) {
    pmVar17 = (mpc_input_t *)malloc(0x40);
    uVar10 = *(undefined4 *)&pmVar14->field_0x4;
    pcVar4 = pmVar14->filename;
    lVar19 = (pmVar14->state).pos;
    lVar18 = (pmVar14->state).row;
    lVar5 = (pmVar14->state).col;
    iVar11 = (pmVar14->state).term;
    uVar12 = *(undefined4 *)&(pmVar14->state).field_0x1c;
    pcVar8 = pmVar14->string;
    ppcVar2 = (char **)pmVar14->buffer;
    pmVar17->type = pmVar14->type;
    *(undefined4 *)&pmVar17->field_0x4 = uVar10;
    pmVar17->filename = pcVar4;
    (pmVar17->state).pos = lVar19;
    (pmVar17->state).row = lVar18;
    (pmVar17->state).col = lVar5;
    (pmVar17->state).term = iVar11;
    *(undefined4 *)&(pmVar17->state).field_0x1c = uVar12;
    pmVar17->string = pcVar8;
    pmVar17->buffer = (char *)ppcVar2;
    i->mem_full[(ulong)((long)pmVar14 - (long)i->mem) >> 6] = '\0';
  }
  r->error = (mpc_err_t *)pmVar17;
  return iVar13;
}

Assistant:

int mpc_parse_input(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r) {
  int x;
  mpc_err_t *e = mpc_err_fail(i, "Unknown Error");
  e->state = mpc_state_invalid();
  x = mpc_parse_run(i, p, r, &e, 0);
  if (x) {
    mpc_err_delete_internal(i, e);
    r->output = mpc_export(i, r->output);
  } else {
    r->error = mpc_err_export(i, mpc_err_merge(i, e, r->error));
  }
  return x;
}